

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::ContainsUntypedPointer(ValidationState_t *this,uint32_t id)

{
  ushort uVar1;
  Instruction *this_00;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  uint id_00;
  const_iterator cVar5;
  ulong uVar6;
  const_iterator cVar7;
  size_t sVar8;
  uint32_t local_20;
  uint32_t local_1c;
  
  local_20 = id;
  cVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_20);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    return false;
  }
  this_00 = *(Instruction **)
             ((long)cVar5.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                    ._M_cur + 0x10);
  if (this_00 == (Instruction *)0x0) {
    return false;
  }
  iVar3 = spvOpcodeGeneratesType((uint)(this_00->inst_).opcode);
  if (iVar3 == 0) {
    return false;
  }
  uVar1 = (this_00->inst_).opcode;
  uVar6 = (ulong)uVar1;
  if (uVar6 < 0x22) {
    if ((0x3b800000UL >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x240000000U >> (uVar6 & 0x3f) & 1) != 0) {
        if ((ulong)((long)(this_00->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
          return false;
        }
        sVar8 = 1;
        uVar4 = 2;
        do {
          id_00 = Instruction::GetOperandAs<unsigned_int>(this_00,sVar8);
          bVar2 = ContainsUntypedPointer(this,id_00);
          if (bVar2) {
            return bVar2;
          }
          sVar8 = (size_t)uVar4;
          uVar4 = uVar4 + 1;
        } while (sVar8 < (ulong)((long)(this_00->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_00->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
        return bVar2;
      }
      if (uVar6 == 0x20) {
        local_1c = id;
        cVar7 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->forward_pointer_ids_)._M_h,&local_1c);
        if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
          return false;
        }
        sVar8 = 2;
        goto LAB_001a959f;
      }
      goto LAB_001a9630;
    }
  }
  else {
LAB_001a9630:
    if (uVar1 == 0x1141) {
      return true;
    }
    if (uVar1 != 0x14ee) {
      return false;
    }
  }
  sVar8 = 1;
LAB_001a959f:
  uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,sVar8);
  bVar2 = ContainsUntypedPointer(this,uVar4);
  return bVar2;
}

Assistant:

bool ValidationState_t::ContainsUntypedPointer(uint32_t id) const {
  const auto inst = FindDef(id);
  if (!inst) return false;
  if (!spvOpcodeGeneratesType(inst->opcode())) return false;
  if (inst->opcode() == spv::Op::OpTypeUntypedPointerKHR) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(1u));
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(2u));
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct: {
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(i)))
          return true;
      }
      return false;
    }
    default:
      return false;
  }

  return false;
}